

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O3

bool __thiscall
PruneReplayer::enqueue_create_raytracing_pipeline
          (PruneReplayer *this,Hash hash,VkRayTracingPipelineCreateInfoKHR *create_info,
          VkPipeline *pipeline)

{
  bool bVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined7 extraout_var;
  const_iterator cVar4;
  const_iterator cVar5;
  mapped_type *ppVVar6;
  uint uVar7;
  uint uVar8;
  VkPipelineLibraryCreateInfoKHR *pVVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  VkPipeline local_48;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  Hash local_38;
  
  *pipeline = (VkPipeline)hash;
  local_38 = hash;
  bVar1 = filter_object(this,RESOURCE_RAYTRACING_PIPELINE,hash);
  if (bVar1) {
    if (create_info->stageCount == 0) {
      uVar10 = 1;
    }
    else {
      lVar12 = 0x18;
      uVar11 = 0;
      do {
        bVar1 = filter_shader_module(this,*(Hash *)((long)&create_info->pStages->sType + lVar12));
        if (bVar1) {
          uVar2 = (undefined4)CONCAT71(extraout_var,1);
          goto LAB_0011309a;
        }
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x30;
      } while (uVar11 < create_info->stageCount);
      uVar2 = 0;
LAB_0011309a:
      uVar10 = 1;
      if ((ulong)create_info->stageCount != 0) {
        local_40 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)CONCAT44(local_40._4_4_,uVar2);
        lVar12 = 0x18;
        uVar11 = 0;
        do {
          local_48 = *(VkPipeline *)((long)&create_info->pStages->sType + lVar12);
          cVar4 = std::
                  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&(this->banned_modules)._M_h,(key_type *)&local_48);
          if (cVar4.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
            uVar10 = 0;
            goto LAB_001130e8;
          }
          uVar11 = uVar11 + 1;
          lVar12 = lVar12 + 0x30;
        } while (uVar11 < create_info->stageCount);
        uVar10 = (uint)local_40;
      }
    }
LAB_001130e8:
    pVVar9 = create_info->pLibraryInfo;
    if ((pVVar9 != (VkPipelineLibraryCreateInfoKHR *)0x0) && (pVVar9->libraryCount != 0)) {
      local_40 = &(this->raytracing_pipelines)._M_h;
      uVar11 = 0;
      uVar8 = 0;
      do {
        local_48 = pVVar9->pLibraries[uVar11];
        cVar4 = std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(this->banned_raytracing)._M_h,(key_type *)&local_48);
        if (cVar4.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
          uVar10 = 0;
          break;
        }
        if (uVar8 == 0) {
          local_48 = create_info->pLibraryInfo->pLibraries[uVar11];
          cVar5 = std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(local_40,(key_type *)&local_48);
          if (cVar5.
              super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false>
              ._M_cur != (__node_type *)0x0) {
            uVar8 = 1;
          }
        }
        uVar7 = uVar10 & 0xff;
        uVar3 = uVar8;
        if ((uVar10 & 1) == 0) {
          uVar3 = uVar7;
        }
        uVar10 = uVar3;
        if (create_info->stageCount != 0) {
          uVar10 = uVar7;
        }
        uVar11 = uVar11 + 1;
        pVVar9 = create_info->pLibraryInfo;
      } while (uVar11 < pVVar9->libraryCount);
    }
    uVar8 = create_info->flags & 0x800;
    if ((uVar8 != 0) && (uVar10 = uVar10 & 0xff, create_info->stageCount == 0)) {
      uVar10 = 0;
    }
    lVar12 = 0x3f8;
    if ((uVar10 & 1) != 0) goto LAB_001131bc;
  }
  else {
    uVar8 = create_info->flags & 0x800;
  }
  lVar12 = 0x468;
  if (uVar8 == 0) {
    return true;
  }
LAB_001131bc:
  ppVVar6 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)((long)&(this->super_StateCreatorInterface)._vptr_StateCreatorInterface
                            + lVar12),&local_38);
  *ppVVar6 = create_info;
  return true;
}

Assistant:

bool enqueue_create_raytracing_pipeline(Hash hash, const VkRayTracingPipelineCreateInfoKHR *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);
		bool allow_pipeline = false;

		if (filter_object(RESOURCE_RAYTRACING_PIPELINE, hash))
		{
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (filter_shader_module((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = true;
					break;
				}
			}

			if (create_info->stageCount == 0)
				allow_pipeline = true;

			// Need to test this as well, if there is at least one banned module used, we don't allow the pipeline.
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (banned_modules.count((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = false;
					break;
				}
			}

			if (create_info->pLibraryInfo)
			{
				bool has_default_allowed_library = false;
				for (uint32_t i = 0; i < create_info->pLibraryInfo->libraryCount; i++)
				{
					if (banned_raytracing.count((Hash) create_info->pLibraryInfo->pLibraries[i]))
					{
						allow_pipeline = false;
						break;
					}

					if (!has_default_allowed_library &&
					    raytracing_pipelines.count((Hash) create_info->pLibraryInfo->pLibraries[i]))
					{
						has_default_allowed_library = true;
					}

					// At least one of the dependent libraries must be considered allowed to pass.
					if (create_info->stageCount == 0 && allow_pipeline)
						allow_pipeline = has_default_allowed_library;
				}
			}

			// Never include libraries by default unless they contain real code.
			if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 && create_info->stageCount == 0)
				allow_pipeline = false;
		}

		// Need to defer this since we need to access pipeline libraries.
		if (allow_pipeline)
			raytracing_pipelines[hash] = create_info;
		else if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0)
			library_raytracing_pipelines[hash] = create_info;

		return true;
	}